

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_flags_decoder.c
# Opt level: O1

lzma_ret lzma_stream_footer_decode(lzma_stream_flags *options,uint8_t *in)

{
  lzma_ret lVar1;
  uint32_t uVar2;
  
  lVar1 = LZMA_FORMAT_ERROR;
  if (*(uint8_t (*) [2])(in + 10) == (uint8_t  [2])0x5a59) {
    uVar2 = lzma_crc32(in + 4,6,0);
    lVar1 = LZMA_DATA_ERROR;
    if (((uVar2 == *(uint32_t *)in) && (lVar1 = LZMA_OPTIONS_ERROR, in[8] == '\0')) &&
       (in[9] < 0x10)) {
      options->version = 0;
      options->check = in[9] & 0xf;
      options->backward_size = (ulong)*(uint *)(in + 4) * 4 + 4;
      lVar1 = LZMA_OK;
    }
  }
  return lVar1;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_stream_footer_decode(lzma_stream_flags *options, const uint8_t *in)
{
	// Magic
	if (memcmp(in + sizeof(uint32_t) * 2 + LZMA_STREAM_FLAGS_SIZE,
			lzma_footer_magic, sizeof(lzma_footer_magic)) != 0)
		return LZMA_FORMAT_ERROR;

	// CRC32
	const uint32_t crc = lzma_crc32(in + sizeof(uint32_t),
			sizeof(uint32_t) + LZMA_STREAM_FLAGS_SIZE, 0);
	if (crc != unaligned_read32le(in))
		return LZMA_DATA_ERROR;

	// Stream Flags
	if (stream_flags_decode(options, in + sizeof(uint32_t) * 2))
		return LZMA_OPTIONS_ERROR;

	// Backward Size
	options->backward_size = unaligned_read32le(in + sizeof(uint32_t));
	options->backward_size = (options->backward_size + 1) * 4;

	return LZMA_OK;
}